

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::FormattingScene::LightSource
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  FileLoc *pFVar10;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ulong uVar11;
  Float FVar12;
  string extra;
  ParameterDictionary dict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Float local_180;
  float local_17c;
  string local_178;
  string local_158;
  ulong *local_138;
  undefined8 local_130;
  ulong local_128;
  undefined8 uStack_120;
  char *local_118;
  long local_110;
  char local_108;
  undefined7 uStack_107;
  ParameterDictionary local_f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  local_1a0._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_90,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&local_1a0);
  ParameterDictionary::ParameterDictionary(&local_f8,&local_90,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_90);
  paVar2 = &local_1a0.field_2;
  local_1a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_1a0,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sLightSource \"%s\"\n",&local_1a0,name)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_110 = 0;
  local_108 = '\0';
  local_118 = &local_108;
  if (this->upgrade == true) {
    local_180 = 1.0;
    bVar6 = upgradeRGBToScale(&local_f8,"scale",&local_180);
    if (!bVar6) {
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"scale","");
      pFVar10 = ParameterDictionary::loc(&local_f8,&local_1a0);
      (this->super_SceneRepresentation).errorExit = true;
      Error(pFVar10,
            "In pbrt-v4, \"scale\" is a \"float\" parameter to light sources. Please modify your scene file manually."
           );
      goto LAB_00344b42;
    }
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"samples","");
    ParameterDictionary::RemoveInt(&local_f8,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"mapname","");
    paVar3 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
    ParameterDictionary::GetOneString(&local_1a0,&local_f8,&local_178,&local_158);
    sVar5 = local_1a0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                               local_178.field_2._M_allocated_capacity._0_4_) + 1);
    }
    paVar4 = &local_178.field_2;
    if (sVar5 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)name);
      if ((iVar7 == 0) && (bVar6 = upgradeRGBToScale(&local_f8,"L",&local_180), !bVar6)) {
        local_1a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"L","");
        pFVar10 = ParameterDictionary::loc(&local_f8,&local_1a0);
        (this->super_SceneRepresentation).errorExit = true;
        Error(pFVar10,
              "Non-constant \"L\" is no longer supported with \"mapname\" for the \"infinite\" light source. Please upgrade your scene file manually."
             );
        goto LAB_00344b42;
      }
      iVar7 = std::__cxx11::string::compare((char *)name);
      if ((iVar7 == 0) && (bVar6 = upgradeRGBToScale(&local_f8,"I",&local_180), !bVar6)) {
        local_1a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"I","");
        pFVar10 = ParameterDictionary::loc(&local_f8,&local_1a0);
        (this->super_SceneRepresentation).errorExit = true;
        Error(pFVar10,
              "\"I\" is no longer supported with \"mapname\" for the \"projection\" light source. Please upgrade your scene file manually."
             );
        goto LAB_00344b42;
      }
    }
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"I","");
    FVar12 = ParameterDictionary::UpgradeBlackbody(&local_f8,&local_1a0);
    local_17c = FVar12 * local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"L","");
    FVar12 = ParameterDictionary::UpgradeBlackbody(&local_f8,&local_1a0);
    local_180 = FVar12 * local_17c;
    local_17c = local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    local_178.field_2._M_allocated_capacity._0_4_ = 0x6e70616d;
    local_178._M_string_length = 7;
    local_158._M_string_length = 0;
    local_178.field_2._M_allocated_capacity._4_4_ = 0x656d61;
    local_158.field_2._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)paVar4;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    ParameterDictionary::GetOneString(&local_1a0,&local_f8,&local_178,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar3) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar4) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                               local_178.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_1a0._M_string_length == 0) {
      local_138 = &local_128;
      local_130 = 0;
      local_128 = local_128 & 0xffffffffffffff00;
    }
    else {
      local_178.field_2._M_allocated_capacity._0_4_ = 0x6e70616d;
      local_178._M_string_length = 7;
      local_178.field_2._M_allocated_capacity._4_4_ = 0x656d61;
      local_178._M_dataplus._M_p = (pointer)paVar4;
      ParameterDictionary::RemoveString(&local_f8,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar4) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                                 local_178.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_178._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct
                ((ulong)&local_178,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)paVar3;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_158,"\"string filename\" \"%s\"\n",&local_1a0);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar4) {
        uVar11 = CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                          local_178.field_2._M_allocated_capacity._0_4_);
      }
      if (uVar11 < local_158._M_string_length + local_178._M_string_length) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar3) {
          uVar11 = CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                            local_158.field_2._M_local_buf[0]);
        }
        if (uVar11 < local_158._M_string_length + local_178._M_string_length) goto LAB_003448b7;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_158,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
      }
      else {
LAB_003448b7:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_178,(ulong)local_158._M_dataplus._M_p);
      }
      local_138 = &local_128;
      puVar1 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar1) {
        local_128 = *puVar1;
        uStack_120 = puVar8[3];
      }
      else {
        local_128 = *puVar1;
        local_138 = (ulong *)*puVar8;
      }
      local_130 = puVar8[1];
      *puVar8 = puVar1;
      puVar8[1] = 0;
      *(undefined1 *)puVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar3) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar4) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                                 local_178.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if ((local_17c != 1.0) || (NAN(local_17c))) {
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"scale","");
      FVar12 = ParameterDictionary::GetOneFloat(&local_f8,&local_1a0,1.0);
      local_180 = FVar12 * local_17c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"scale","");
      ParameterDictionary::RemoveFloat(&local_f8,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1a0,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      Printf<std::__cxx11::string,float&>("%s\"float scale\" [%f]\n",&local_1a0,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_118,local_110);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_1a0,&local_f8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
LAB_00344b42:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_f8.params);
  return;
}

Assistant:

void FormattingScene::LightSource(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);

    Printf("%sLightSource \"%s\"\n", indent(), name);

    std::string extra;
    if (upgrade) {
        Float totalScale = 1;
        if (!upgradeRGBToScale(&dict, "scale", &totalScale)) {
            ErrorExitDeferred(dict.loc("scale"),
                              "In pbrt-v4, \"scale\" is a \"float\" parameter "
                              "to light sources. "
                              "Please modify your scene file manually.");
            return;
        }
        dict.RemoveInt("samples");

        if (dict.GetOneString("mapname", "").empty() == false) {
            if (name == "infinite" && !upgradeRGBToScale(&dict, "L", &totalScale)) {
                ErrorExitDeferred(
                    dict.loc("L"),
                    "Non-constant \"L\" is no longer supported with "
                    "\"mapname\" for "
                    "the \"infinite\" light source. Please upgrade your scene "
                    "file manually.");
                return;
            } else if (name == "projection" &&
                       !upgradeRGBToScale(&dict, "I", &totalScale)) {
                ErrorExitDeferred(
                    dict.loc("I"),
                    "\"I\" is no longer supported with \"mapname\" for "
                    "the \"projection\" light source. Please upgrade your scene "
                    "file manually.");
                return;
            }
        }

        totalScale *= dict.UpgradeBlackbody("I");
        totalScale *= dict.UpgradeBlackbody("L");

        // Do this after we've handled infinite "L" with a map, since
        // it removes the "mapname" parameter from the dictionary.
        extra += upgradeMapname(*this, &dict);

        if (totalScale != 1) {
            totalScale *= dict.GetOneFloat("scale", 1.f);
            dict.RemoveFloat("scale");
            Printf("%s\"float scale\" [%f]\n", indent(1), totalScale);
        }
    }

    std::cout << extra << dict.ToParameterList(catIndentCount);
}